

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O2

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:2041:59)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  size_t sVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  pthread_mutex_t *__mutex;
  vector<int,_std::allocator<int>_> *pvVar4;
  code *pcVar5;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  variant_alternative_t<0UL,_variant<int,_monostate>_> *pvVar6;
  Enum EVar7;
  int iVar8;
  variant<int,std::monostate> *this_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  variant_alternative_t<0UL,_variant<int,_monostate>_> local_ec;
  Result local_e8;
  ResultBuilder DOCTEST_RB;
  Expression_lhs<const_unsigned_long_&> local_50;
  size_t local_40;
  pthread_mutex_t *local_38;
  
  EVar7 = DT_REQUIRE;
  switch(pf->_pipe) {
  case 0:
    psVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
             .
             super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_false>
             ._M_head_impl._callable.j1;
    sVar1 = *psVar2;
    if (sVar1 == *(this->_pipes).
                  super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                  .
                  super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_false>
                  ._M_head_impl._callable.N) {
      Pipeflow::stop(pf);
      iVar8 = 0;
    }
    else {
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x7de;
      DOCTEST_RB.super_AssertData.m_expr = "j1 == source[j1]";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      DOCTEST_RB.super_AssertData.m_at = EVar7;
      local_50.lhs = psVar2;
      local_50.m_at = EVar7;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                (&local_e8,&local_50,
                 (((this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                   .
                   super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_false>
                   ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start + sVar1);
      doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
      doctest::String::~String(&local_e8.m_decomp);
      doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_06);
      if (extraout_AL_06 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      doctest::detail::ResultBuilder::react(&DOCTEST_RB);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x7df;
      DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_50.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_false>
                     ._M_head_impl._callable.L);
      local_40 = pf->_line;
      DOCTEST_RB.super_AssertData.m_at = EVar7;
      local_50.m_at = EVar7;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_e8,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
      doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
      doctest::String::~String(&local_e8.m_decomp);
      doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_07);
      if (extraout_AL_07 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      doctest::detail::ResultBuilder::react(&DOCTEST_RB);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      pvVar4 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_false>
               ._M_head_impl._callable.source;
      psVar2 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_false>
               ._M_head_impl._callable.j1;
      sVar1 = *psVar2;
      *psVar2 = sVar1 + 1;
      iVar8 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar1] + 1;
    }
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(DOCTEST_RB.super_AssertData.m_test_case._4_4_,iVar8);
    break;
  case 1:
    pvVar6 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_ec = *pvVar6;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7e6;
    DOCTEST_RB.super_AssertData.m_expr = "j2++ < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    paVar3 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
             .
             super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
             .
             super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_false>
             ._M_head_impl._callable.j2;
    LOCK();
    local_50.lhs = (unsigned_long *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
              (&local_e8,(Expression_lhs<const_unsigned_long> *)&local_50,
               (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_false>
               ._M_head_impl._callable.N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_04);
    if (extraout_AL_04 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    local_38 = (pthread_mutex_t *)
               (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_false>
               ._M_head_impl._callable.mutex2;
    std::mutex::lock((mutex *)&local_38->__data);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7e9;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_false>
                   ._M_head_impl._callable.L);
    local_40 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e8,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_05);
    if (extraout_AL_05 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::vector<int,_std::allocator<int>_>::push_back
              ((this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_false>
               ._M_head_impl._callable.collection2,&local_ec);
    iVar8 = local_ec + 1;
    pthread_mutex_unlock(local_38);
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(DOCTEST_RB.super_AssertData.m_test_case._4_4_,iVar8);
    break;
  case 2:
    pvVar6 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_ec = *pvVar6;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7f1;
    DOCTEST_RB.super_AssertData.m_expr = "j3 < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_false>
                            ._M_head_impl._callable + 0x10);
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_e8,&local_50,
               (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
               .
               super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_false>
               ._M_head_impl._callable.N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
    if (extraout_AL != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7f2;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_false>
                            ._M_head_impl._callable + 0x18));
    local_40 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e8,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7f3;
    DOCTEST_RB.super_AssertData.m_expr = "source[j3] + 2 == input";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                                       .
                                       super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_false>
                                       ._M_head_impl._callable + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                                       .
                                       super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_false>
                                       ._M_head_impl._callable + 0x10)] + 2) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_e8,(Expression_lhs<const_int> *)&local_50,&local_ec);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_01);
    if (extraout_AL_01 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    psVar2 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_false>
                      ._M_head_impl._callable + 0x10);
    *psVar2 = *psVar2 + 1;
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(DOCTEST_RB.super_AssertData.m_test_case._4_4_,local_ec + 1);
    this_00 = (variant<int,std::monostate> *)
              ((this->_buffer).
               super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pf->_line);
    goto LAB_001363fb;
  case 3:
    pvVar6 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_ec = *pvVar6;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7fa;
    DOCTEST_RB.super_AssertData.m_expr = "j4++ < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    paVar3 = *(atomic<unsigned_long> **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                      .
                      super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>,_false>
                      ._M_head_impl + 0x10);
    LOCK();
    local_50.lhs = (unsigned_long *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
              (&local_e8,(Expression_lhs<const_unsigned_long> *)&local_50,
               ((callable_t *)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>,_false>
                       ._M_head_impl + 8))->N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_02);
    if (extraout_AL_02 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    __mutex = *(pthread_mutex_t **)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                       .
                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>,_false>
                       ._M_head_impl + 0x18);
    std::mutex::lock((mutex *)&__mutex->__data);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x7fd;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>,_false>
                            ._M_head_impl + 0x28));
    local_40 = pf->_line;
    local_50.m_at = DOCTEST_RB.super_AssertData.m_at;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e8,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
    doctest::String::~String(&local_e8.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_03);
    if (extraout_AL_03 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::vector<int,_std::allocator<int>_>::push_back
              (*(vector<int,_std::allocator<int>_> **)
                ((long)&(this->_pipes).
                        super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2009:66)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                        .
                        super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2021:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                        .
                        super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2032:56)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                        .
                        super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>_>
                        .
                        super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:2041:59)>,_false>
                        ._M_head_impl + 0x20),&local_ec);
    pthread_mutex_unlock(__mutex);
  default:
    goto switchD_00135b96_default;
  }
  this_00 = (variant<int,std::monostate> *)
            ((this->_buffer).
             super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + pf->_line);
LAB_001363fb:
  std::variant<int,std::monostate>::operator=(this_00,(int *)&DOCTEST_RB);
switchD_00135b96_default:
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}